

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

optional<(anonymous_namespace)::cmSourceInfo> *
anon_unknown.dwarf_1257b71::cmcmd_cmake_ninja_depends_fortran
          (optional<(anonymous_namespace)::cmSourceInfo> *__return_storage_ptr__,string *arg_tdi,
          string *arg_src,string *arg_src_orig)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  Value *pVVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  size_t *psVar7;
  size_type sVar8;
  reference __x;
  cmSourceInfo *pcVar9;
  const_iterator cVar10;
  string_view sVar11;
  string *include;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  cmSourceReqInfo src_info_1;
  string *require;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string_view local_ac8;
  string_view local_ab8;
  undefined1 local_aa8 [8];
  string mod;
  cmSourceReqInfo src_info;
  string *provide;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_980;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_960;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_930;
  cmFortranCompiler local_918;
  undefined1 local_8b8 [8];
  cmFortranParser parser;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmFortranSourceInfo finfo;
  Value *tdi_submodule_ext;
  Value *local_5b8;
  Value *tdi_submodule_sep;
  Value *local_590;
  Value *tdi_compiler_id;
  char *local_580;
  String local_578;
  Value *local_558;
  Value *tdi_module_dir;
  reference local_530;
  Value *tdi_include_dir;
  undefined1 local_520;
  undefined1 local_518 [8];
  const_iterator __end3;
  undefined1 local_4f8 [8];
  const_iterator __begin3;
  Value *__range3;
  Value *tdi_include_dirs;
  String local_4c8;
  uint local_4a4;
  String local_4a0;
  string local_480;
  undefined1 local_460 [8];
  Reader reader;
  ifstream tdif;
  Value *tdi;
  Value tdio;
  undefined1 local_108 [8];
  string src_orig_dir;
  string module_dir;
  string dir_top_bld;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  cmFortranCompiler fc;
  string *arg_src_orig_local;
  string *arg_src_local;
  string *arg_tdi_local;
  optional<(anonymous_namespace)::cmSourceInfo> *info;
  
  fc.SModExt.field_2._M_local_buf[0xf] = '\0';
  std::optional<(anonymous_namespace)::cmSourceInfo>::optional(__return_storage_ptr__);
  cmFortranCompiler::cmFortranCompiler
            ((cmFortranCompiler *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&dir_top_bld.field_2 + 8));
  std::__cxx11::string::string((string *)(module_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(src_orig_dir.field_2._M_local_buf + 8));
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmsys::SystemTools::GetParentDirectory((string *)local_108,arg_src_orig);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&dir_top_bld.field_2 + 8),(value_type *)local_108);
    }
    std::__cxx11::string::~string((string *)local_108);
  }
  Json::Value::Value((Value *)&tdi,nullValue);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&reader.features_,pcVar5,_Var2);
  Json::Reader::Reader((Reader *)local_460);
  bVar1 = Json::Reader::parse((Reader *)local_460,(istream *)&reader.features_,(Value *)&tdi,false);
  if (!bVar1) {
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_4a0,(Reader *)local_460);
    cmStrCat<char_const(&)[40],std::__cxx11::string_const&,std::__cxx11::string>
              (&local_480,(char (*) [40])"-E cmake_ninja_depends failed to parse ",arg_tdi,
               &local_4a0);
    cmSystemTools::Error(&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    fc.SModExt.field_2._M_local_buf[0xf] = '\x01';
  }
  local_4a4 = (uint)!bVar1;
  Json::Reader::~Reader((Reader *)local_460);
  std::ifstream::~ifstream(&reader.features_);
  if (local_4a4 == 0) {
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"dir-top-bld");
    Json::Value::asString_abi_cxx11_(&local_4c8,pVVar6);
    std::__cxx11::string::operator=
              ((string *)(module_dir.field_2._M_local_buf + 8),(string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(module_dir.field_2._M_local_buf + 8));
      bVar1 = cmHasLiteralSuffix<2ul>(sVar11,(char (*) [2])0x12fb511);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)(module_dir.field_2._M_local_buf + 8),'/');
      }
    }
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"include-dirs");
    bVar1 = Json::Value::isArray(pVVar6);
    if (bVar1) {
      __begin3.super_ValueIteratorBase._8_8_ = pVVar6;
      cVar10 = Json::Value::begin(pVVar6);
      __end3.super_ValueIteratorBase._8_8_ = cVar10.super_ValueIteratorBase.current_._M_node;
      __begin3.super_ValueIteratorBase.current_._M_node._0_1_ =
           cVar10.super_ValueIteratorBase.isNull_;
      local_4f8 = (undefined1  [8])__end3.super_ValueIteratorBase._8_8_;
      cVar10 = Json::Value::end((Value *)__begin3.super_ValueIteratorBase._8_8_);
      tdi_include_dir = (Value *)cVar10.super_ValueIteratorBase.current_._M_node;
      local_520 = cVar10.super_ValueIteratorBase.isNull_;
      local_518 = (undefined1  [8])tdi_include_dir;
      __end3.super_ValueIteratorBase.current_._M_node._0_1_ = local_520;
      while (bVar1 = Json::ValueIteratorBase::operator!=
                               ((ValueIteratorBase *)local_4f8,(SelfType *)local_518), bVar1) {
        local_530 = Json::ValueConstIterator::operator*((ValueConstIterator *)local_4f8);
        Json::Value::asString_abi_cxx11_((String *)&tdi_module_dir,local_530);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&dir_top_bld.field_2 + 8),(value_type *)&tdi_module_dir);
        std::__cxx11::string::~string((string *)&tdi_module_dir);
        Json::ValueConstIterator::operator++((ValueConstIterator *)local_4f8);
      }
    }
    local_558 = Json::Value::operator[]((Value *)&tdi,"module-dir");
    Json::Value::asString_abi_cxx11_(&local_578,local_558);
    std::__cxx11::string::operator=
              ((string *)(src_orig_dir.field_2._M_local_buf + 8),(string *)&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(src_orig_dir.field_2._M_local_buf + 8));
      local_580 = sVar11._M_str;
      tdi_compiler_id = (Value *)sVar11._M_len;
      bVar1 = cmHasLiteralSuffix<2ul>(sVar11,(char (*) [2])0x12fb511);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)(src_orig_dir.field_2._M_local_buf + 8),'/');
      }
    }
    local_590 = Json::Value::operator[]((Value *)&tdi,"compiler-id");
    Json::Value::asString_abi_cxx11_((String *)&tdi_submodule_sep,local_590);
    std::__cxx11::string::operator=
              ((string *)
               &includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&tdi_submodule_sep);
    std::__cxx11::string::~string((string *)&tdi_submodule_sep);
    local_5b8 = Json::Value::operator[]((Value *)&tdi,"submodule-sep");
    Json::Value::asString_abi_cxx11_((String *)&tdi_submodule_ext,local_5b8);
    std::__cxx11::string::operator=
              ((string *)(fc.Id.field_2._M_local_buf + 8),(string *)&tdi_submodule_ext);
    std::__cxx11::string::~string((string *)&tdi_submodule_ext);
    pVVar6 = Json::Value::operator[]((Value *)&tdi,"submodule-ext");
    Json::Value::asString_abi_cxx11_
              ((String *)&finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count,pVVar6);
    std::__cxx11::string::operator=
              ((string *)(fc.SModSep.field_2._M_local_buf + 8),
               (string *)&finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string
              ((string *)&finfo.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_4a4 = 0;
  }
  Json::Value::~Value((Value *)&tdi);
  if (local_4a4 == 0) {
    cmFortranSourceInfo::cmFortranSourceInfo
              ((cmFortranSourceInfo *)&defines._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&parser.Info);
    cmFortranCompiler::cmFortranCompiler
              (&local_918,
               (cmFortranCompiler *)
               &includes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_930,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&dir_top_bld.field_2 + 8));
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_960,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&parser.Info);
    cmFortranParser_s::cmFortranParser_s
              ((cmFortranParser_s *)local_8b8,&local_918,&local_930,&local_960,
               (cmFortranSourceInfo *)&defines._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_960);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_930);
    cmFortranCompiler::~cmFortranCompiler(&local_918);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmFortranParser_FilePush((cmFortranParser *)local_8b8,pcVar5);
    if (bVar1) {
      iVar3 = cmFortran_yyparse(parser.IncludePath.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (iVar3 == 0) {
        memset(&__range1,0,0x80);
        cmSourceInfo::cmSourceInfo((cmSourceInfo *)&__range1);
        std::optional<(anonymous_namespace)::cmSourceInfo>::operator=
                  (__return_storage_ptr__,(cmSourceInfo *)&__range1);
        cmSourceInfo::~cmSourceInfo((cmSourceInfo *)&__range1);
        this = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&finfo.Source.field_2 + 8);
        __end1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this);
        provide = (string *)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(this);
        while( true ) {
          bVar1 = std::operator!=(&__end1,(_Self *)&provide);
          if (!bVar1) break;
          src_info._96_8_ =
               std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
          cmSourceReqInfo::cmSourceReqInfo((cmSourceReqInfo *)(mod.field_2._M_local_buf + 8));
          std::__cxx11::string::operator=
                    ((string *)(mod.field_2._M_local_buf + 8),(string *)src_info._96_8_);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
                      ((string *)local_aa8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&src_orig_dir.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       src_info._96_8_);
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              sVar11 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_aa8)
              ;
              local_ab8 = sVar11;
              sVar11 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)(module_dir.field_2._M_local_buf + 8));
              local_ac8 = sVar11;
              bVar1 = cmHasPrefix(local_ab8,sVar11);
              if (bVar1) {
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)&__range1_1,(ulong)local_aa8);
                std::__cxx11::string::operator=((string *)local_aa8,(string *)&__range1_1);
                std::__cxx11::string::~string((string *)&__range1_1);
              }
            }
            std::__cxx11::string::operator=
                      ((string *)(src_info.SourcePath.field_2._M_local_buf + 8),(string *)local_aa8)
            ;
            std::__cxx11::string::~string((string *)local_aa8);
          }
          pcVar9 = std::optional<(anonymous_namespace)::cmSourceInfo>::operator->
                             (__return_storage_ptr__);
          std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
          emplace_back<cmSourceReqInfo&>
                    ((vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)
                     &(pcVar9->ScanDep).Provides,(cmSourceReqInfo *)((long)&mod.field_2 + 8));
          cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)((long)&mod.field_2 + 8));
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end1);
        }
        psVar7 = &finfo.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end1_1 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)psVar7);
        require = (string *)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)psVar7);
        while( true ) {
          bVar1 = std::operator!=(&__end1_1,(_Self *)&require);
          if (!bVar1) break;
          src_info_1._96_8_ =
               std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1_1);
          sVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&finfo.Source.field_2 + 8),(key_type *)src_info_1._96_8_);
          if (sVar8 == 0) {
            cmSourceReqInfo::cmSourceReqInfo((cmSourceReqInfo *)&__range1_2);
            std::__cxx11::string::operator=((string *)&__range1_2,(string *)src_info_1._96_8_);
            pcVar9 = std::optional<(anonymous_namespace)::cmSourceInfo>::operator->
                               (__return_storage_ptr__);
            std::vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>>::
            emplace_back<cmSourceReqInfo&>
                      ((vector<cmSourceReqInfo,std::allocator<cmSourceReqInfo>> *)
                       &(pcVar9->ScanDep).Requires,(cmSourceReqInfo *)&__range1_2);
            cmSourceReqInfo::~cmSourceReqInfo((cmSourceReqInfo *)&__range1_2);
          }
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end1_1);
        }
        psVar7 = &finfo.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end1_2 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)psVar7);
        include = (string *)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)psVar7);
        while( true ) {
          bVar1 = std::operator!=(&__end1_2,(_Self *)&include);
          if (!bVar1) break;
          __x = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end1_2);
          pcVar9 = std::optional<(anonymous_namespace)::cmSourceInfo>::operator->
                             (__return_storage_ptr__);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pcVar9->Includes,__x);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end1_2);
        }
      }
    }
    else {
      cmStrCat<char_const(&)[39],std::__cxx11::string_const&>
                (&local_980,(char (*) [39])"-E cmake_ninja_depends failed to open ",arg_src);
      cmSystemTools::Error(&local_980);
      std::__cxx11::string::~string((string *)&local_980);
    }
    fc.SModExt.field_2._M_local_buf[0xf] = '\x01';
    local_4a4 = 1;
    cmFortranParser_s::~cmFortranParser_s((cmFortranParser_s *)local_8b8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parser.Info);
    cmFortranSourceInfo::~cmFortranSourceInfo
              ((cmFortranSourceInfo *)&defines._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::__cxx11::string::~string((string *)(src_orig_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(module_dir.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&dir_top_bld.field_2 + 8));
  cmFortranCompiler::~cmFortranCompiler
            ((cmFortranCompiler *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((fc.SModExt.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::optional<(anonymous_namespace)::cmSourceInfo>::~optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmSourceInfo> cmcmd_cmake_ninja_depends_fortran(
  std::string const& arg_tdi, std::string const& arg_src,
  std::string const& arg_src_orig)
{
  cm::optional<cmSourceInfo> info;
  cmFortranCompiler fc;
  std::vector<std::string> includes;
  std::string dir_top_bld;
  std::string module_dir;

  if (!arg_src_orig.empty()) {
    // Prepend the original source file's directory as an include directory
    // so Fortran INCLUDE statements can look for files in it.
    std::string src_orig_dir = cmSystemTools::GetParentDirectory(arg_src_orig);
    if (!src_orig_dir.empty()) {
      includes.push_back(src_orig_dir);
    }
  }

  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error(
          cmStrCat("-E cmake_ninja_depends failed to parse ", arg_tdi,
                   reader.getFormattedErrorMessages()));
        return info;
      }
    }

    dir_top_bld = tdi["dir-top-bld"].asString();
    if (!dir_top_bld.empty() && !cmHasLiteralSuffix(dir_top_bld, "/")) {
      dir_top_bld += '/';
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (auto const& tdi_include_dir : tdi_include_dirs) {
        includes.push_back(tdi_include_dir.asString());
      }
    }

    Json::Value const& tdi_module_dir = tdi["module-dir"];
    module_dir = tdi_module_dir.asString();
    if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
      module_dir += '/';
    }

    Json::Value const& tdi_compiler_id = tdi["compiler-id"];
    fc.Id = tdi_compiler_id.asString();

    Json::Value const& tdi_submodule_sep = tdi["submodule-sep"];
    fc.SModSep = tdi_submodule_sep.asString();

    Json::Value const& tdi_submodule_ext = tdi["submodule-ext"];
    fc.SModExt = tdi_submodule_ext.asString();
  }

  cmFortranSourceInfo finfo;
  std::set<std::string> defines;
  cmFortranParser parser(fc, includes, defines, finfo);
  if (!cmFortranParser_FilePush(&parser, arg_src.c_str())) {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_depends failed to open ", arg_src));
    return info;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return info;
  }

  info = cmSourceInfo();
  for (std::string const& provide : finfo.Provides) {
    cmSourceReqInfo src_info;
    src_info.LogicalName = provide;
    if (!module_dir.empty()) {
      std::string mod = cmStrCat(module_dir, provide);
      if (!dir_top_bld.empty() && cmHasPrefix(mod, dir_top_bld)) {
        mod = mod.substr(dir_top_bld.size());
      }
      src_info.CompiledModulePath = std::move(mod);
    }
    info->ScanDep.Provides.emplace_back(src_info);
  }
  for (std::string const& require : finfo.Requires) {
    // Require modules not provided in the same source.
    if (finfo.Provides.count(require)) {
      continue;
    }
    cmSourceReqInfo src_info;
    src_info.LogicalName = require;
    info->ScanDep.Requires.emplace_back(src_info);
  }
  for (std::string const& include : finfo.Includes) {
    info->Includes.push_back(include);
  }
  return info;
}